

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O3

pair<RenX::LadderDatabase::Entry_*,_unsigned_long> __thiscall
RenX::LadderDatabase::getPlayerEntryAndIndexByName(LadderDatabase *this,string_view name)

{
  bool bVar1;
  unsigned_long uVar2;
  Entry *pEVar3;
  pair<RenX::LadderDatabase::Entry_*,_unsigned_long> pVar4;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  pEVar3 = this->m_head;
  if (pEVar3 != (Entry *)0x0) {
    uVar2 = 0;
    do {
      lhs._M_str = (pEVar3->most_recent_name)._M_dataplus._M_p;
      lhs._M_len = (pEVar3->most_recent_name)._M_string_length;
      bVar1 = jessilib::equalsi<char,char>(lhs,name);
      if (bVar1) goto LAB_00125192;
      uVar2 = uVar2 + 1;
      pEVar3 = pEVar3->next;
    } while (pEVar3 != (Entry *)0x0);
  }
  pEVar3 = (Entry *)0x0;
  uVar2 = 0xffffffffffffffff;
LAB_00125192:
  pVar4.second = uVar2;
  pVar4.first = pEVar3;
  return pVar4;
}

Assistant:

std::pair<RenX::LadderDatabase::Entry *, size_t> RenX::LadderDatabase::getPlayerEntryAndIndexByName(std::string_view name) const {
	size_t index = 0;
	for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
		if (jessilib::equalsi(itr->most_recent_name, name)) {
			return std::pair<Entry*, size_t>(itr, index);
		}
	}

	return std::pair<Entry*, size_t>(nullptr, SIZE_MAX);
}